

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O0

void __thiscall
CorUnix::CSynchCache<CorUnix::_WaitingThreadsListNode>::Add
          (CSynchCache<CorUnix::_WaitingThreadsListNode> *this,CPalThread *pthrCurrent,
          _WaitingThreadsListNode *pobj)

{
  int iVar1;
  _USynchCacheStackNode *p_Var2;
  USynchCacheStackNode *pNode;
  _WaitingThreadsListNode *pobj_local;
  CPalThread *pthrCurrent_local;
  CSynchCache<CorUnix::_WaitingThreadsListNode> *this_local;
  
  if (pobj != (_WaitingThreadsListNode *)0x0) {
    Lock(this,pthrCurrent);
    iVar1 = ::Volatile::operator_cast_to_int((Volatile *)&this->m_iDepth);
    if (iVar1 < this->m_iMaxDepth) {
      iVar1 = ::Volatile::operator_cast_to_int((Volatile *)&this->m_iDepth);
      if (this->m_iMaxTrackedDepth < iVar1) {
        iVar1 = ::Volatile::operator_cast_to_int((Volatile *)&this->m_iDepth);
        this->m_iMaxTrackedDepth = iVar1;
      }
      p_Var2 = ::Volatile::operator_cast_to__USynchCacheStackNode_((Volatile *)this);
      (pobj->ptrNext).ptr = (_WaitingThreadsListNode *)p_Var2;
      Volatile<CorUnix::CSynchCache<CorUnix::_WaitingThreadsListNode>::_USynchCacheStackNode_*>::
      operator=(&this->m_pHead,(_USynchCacheStackNode *)pobj);
      Volatile<int>::operator++(&this->m_iDepth,0);
    }
    else {
      InternalDelete<char>((char *)pobj);
    }
    Unlock(this,pthrCurrent);
  }
  return;
}

Assistant:

void Add(CPalThread * pthrCurrent, T * pobj)
        {
            USynchCacheStackNode * pNode = reinterpret_cast<USynchCacheStackNode *>(pobj);

            if (NULL == pobj)
            {
                return;
            }

            pobj->~T();
            
            Lock(pthrCurrent);
            if (m_iDepth < m_iMaxDepth)
            {
#ifdef _DEBUG
                if (m_iDepth > m_iMaxTrackedDepth)
                {
                    m_iMaxTrackedDepth = m_iDepth;
                }
#endif
                pNode->next = m_pHead;
                m_pHead = pNode;
                m_iDepth++;
            }
            else
            {
                InternalDelete((char *)pNode);
            }
            Unlock(pthrCurrent);
        }